

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O2

void __thiscall
memt::Arena::
freeTopArray<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,0ul>>
          (Arena *this,_frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *array,
          _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *arrayEnd)

{
  ostream *poVar1;
  
  for (; arrayEnd != array; arrayEnd = arrayEnd + -1) {
    poVar1 = std::operator<<((ostream *)
                             &(anonymous_namespace)::
                              _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,0ul>::
                              _log_abi_cxx11_,'-');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  freeTop(this,array);
  return;
}

Assistant:

void Arena::freeTopArray(T* array, T* arrayEnd) {
    MEMT_ASSERT(array != 0);
    MEMT_ASSERT(array <= arrayEnd);

    while (arrayEnd != array) {
      --arrayEnd;
      arrayEnd->~T();
    }
    freeTop(array);
  }